

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O2

string * __thiscall
toml::detail::show_char_abi_cxx11_(string *__return_storage_ptr__,detail *this,int c)

{
  int iVar1;
  string *in_hex;
  int iVar2;
  char *__s;
  allocator<char> local_21;
  array<char,_5UL> buf;
  
  iVar2 = (int)this;
  iVar1 = isgraph(iVar2);
  if (iVar1 == 0) {
    buf._M_elems[4] = '\0';
    buf._M_elems[0] = '\0';
    buf._M_elems[1] = '\0';
    buf._M_elems[2] = '\0';
    buf._M_elems[3] = '\0';
    snprintf(buf._M_elems,5,"0x%02x",(ulong)this & 0xff);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,buf._M_elems,&local_21);
    switch((ulong)this & 0xffffffff) {
    case 0:
      __s = "(NUL)";
      break;
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      goto switchD_001aa548_caseD_1;
    case 9:
      __s = "(TAB)";
      break;
    case 10:
      __s = "(LINE FEED)";
      break;
    case 0xb:
      __s = "(VERTICAL TAB)";
      break;
    case 0xc:
      __s = "(FORM FEED)";
      break;
    case 0xd:
      __s = "(CARRIAGE RETURN)";
      break;
    default:
      if (iVar2 == 0x1b) {
        __s = "(ESCAPE)";
      }
      else {
        if (iVar2 != 0x20) {
          return __return_storage_ptr__;
        }
        __s = "(SPACE)";
      }
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,__s);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = (char)this;
    __return_storage_ptr__->_M_string_length = 1;
    (__return_storage_ptr__->field_2)._M_local_buf[1] = '\0';
  }
switchD_001aa548_caseD_1:
  return __return_storage_ptr__;
}

Assistant:

inline std::string show_char(const int c)
{
    using char_type = unsigned char;
    if(std::isgraph(c))
    {
        return std::string(1, static_cast<char>(c));
    }
    else
    {
        std::array<char, 5> buf;
        buf.fill('\0');
        const auto r = std::snprintf(buf.data(), buf.size(), "0x%02x", c & 0xFF);
        assert(r == static_cast<int>(buf.size()) - 1);
        (void) r; // Unused variable warning
        auto in_hex = std::string(buf.data());
        switch(c)
        {
            case char_type('\0'):   {in_hex += "(NUL)";             break;}
            case char_type(' ') :   {in_hex += "(SPACE)";           break;}
            case char_type('\n'):   {in_hex += "(LINE FEED)";       break;}
            case char_type('\r'):   {in_hex += "(CARRIAGE RETURN)"; break;}
            case char_type('\t'):   {in_hex += "(TAB)";             break;}
            case char_type('\v'):   {in_hex += "(VERTICAL TAB)";    break;}
            case char_type('\f'):   {in_hex += "(FORM FEED)";       break;}
            case char_type('\x1B'): {in_hex += "(ESCAPE)";          break;}
            default: break;
        }
        return in_hex;
    }
}